

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerline.cc
# Opt level: O0

char * bg2fg(char *s)

{
  char *pcVar1;
  char *in_RDI;
  char *substr;
  
  pcVar1 = strchr(in_RDI,0x2c);
  bg2fg::buf[0] = '#';
  bg2fg::buf[1] = '[';
  bg2fg::buf[2] = 'f';
  strcpy(bg2fg::buf + 3,pcVar1 + 2);
  return bg2fg::buf;
}

Assistant:

const char * bg2fg( const char s[] )
{
  static char buf[40] = {0};
  const char *substr = strchr(s, ',');
  buf[0] = '#';
  buf[1] = '[';
  buf[2] = 'f';
  strcpy(buf+3, substr+2);
  return buf;
}